

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionContext::AddInput(TransactionContext *this,UtxoData *utxo,uint32_t sequence)

{
  bool bVar1;
  CfdException *this_00;
  Utxo temp;
  UtxoData dest;
  
  bVar1 = core::Txid::IsValid(&utxo->txid);
  if (bVar1) {
    UtxoData::UtxoData(&dest);
    memset(&temp,0,0xd8);
    UtxoUtil::ConvertToUtxo(utxo,&temp,&dest);
    core::Transaction::AddTxIn
              (&this->super_Transaction,&utxo->txid,utxo->vout,sequence,
               (Script *)core::Script::Empty);
    std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
              ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)&this->utxo_map_,&dest);
    UtxoData::~UtxoData(&dest);
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&dest,"Failed to AddInput. invalid utxo txid.",(allocator *)&temp);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&dest);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContext::AddInput(const UtxoData& utxo, uint32_t sequence) {
  if (!utxo.txid.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to AddInput. invalid utxo txid.");
  }

  UtxoData dest;
  Utxo temp;
  memset(&temp, 0, sizeof(temp));
  UtxoUtil::ConvertToUtxo(utxo, &temp, &dest);

  AddTxIn(utxo.txid, utxo.vout, sequence);
  utxo_map_.emplace_back(dest);
}